

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O0

int testUpwardPass(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  ArrayFeatureType_ShapeRange *pAVar5;
  SizeRange *pSVar6;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *pNVar7;
  ConvolutionLayerParams *this_01;
  WeightParams *pWVar8;
  InnerProductLayerParams *this_02;
  ShapeConstraint *this_03;
  ShapeRange *pSVar9;
  size_t sVar10;
  ostream *poVar11;
  RangeValue RVar12;
  RangeValue local_1a0;
  RangeValue local_190;
  RangeValue local_180;
  RangeValue local_170;
  RangeValue local_160;
  undefined4 local_150;
  allocator<char> local_149;
  string local_148;
  ShapeConstraint *local_128;
  ShapeConstraint *inShape;
  NeuralNetworkShaper shapes;
  int i_1;
  InnerProductLayerParams *ipParams;
  NeuralNetworkLayer *ipLayer;
  int i;
  ConvolutionLayerParams *convParams;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out;
  SizeRange *shape3;
  SizeRange *shape2;
  SizeRange *shape1;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,4);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,4);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,1);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,1);
  pAVar5 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar6 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(pAVar5);
  CoreML::Specification::SizeRange::set_lowerbound(pSVar6,1);
  CoreML::Specification::SizeRange::set_upperbound(pSVar6,-1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  pNVar7 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,"conv_out");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution(pNVar7);
  CoreML::Specification::ConvolutionLayerParams::set_outputchannels(this_01,5);
  CoreML::Specification::ConvolutionLayerParams::set_kernelchannels(this_01,4);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_01,1);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_01,10);
  CoreML::Specification::ConvolutionLayerParams::mutable_valid(this_01);
  CoreML::Specification::ConvolutionLayerParams::set_hasbias(this_01,false);
  for (ipLayer._4_4_ = 0; ipLayer._4_4_ < 200; ipLayer._4_4_ = ipLayer._4_4_ + 1) {
    pWVar8 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(this_01);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar8,1.0);
  }
  pNVar7 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,"conv_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,"output");
  this_02 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar7);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(this_02,5);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(this_02,1);
  CoreML::Specification::InnerProductLayerParams::set_hasbias(this_02,false);
  for (shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 5;
      shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           shapes.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
    pWVar8 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_02);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar8,1.0);
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper
            ((NeuralNetworkShaper *)&inShape,(Model *)&topIn,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"input",&local_149);
  this_03 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)&inShape,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  local_128 = this_03;
  pSVar9 = CoreML::ShapeConstraint::sequenceRange(this_03);
  sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
  if (sVar10 == 0) {
    pSVar9 = CoreML::ShapeConstraint::sequenceRange(local_128);
    RVar12 = CoreML::ShapeRange::maximumValue(pSVar9);
    local_160._val = RVar12._val;
    local_160._isUnbound = RVar12._isUnbound;
    bVar1 = CoreML::RangeValue::isUnbound(&local_160);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pSVar9 = CoreML::ShapeConstraint::batchRange(local_128);
      sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
      if (sVar10 == 0) {
        pSVar9 = CoreML::ShapeConstraint::batchRange(local_128);
        RVar12 = CoreML::ShapeRange::maximumValue(pSVar9);
        local_170._val = RVar12._val;
        local_170._isUnbound = RVar12._isUnbound;
        bVar1 = CoreML::RangeValue::isUnbound(&local_170);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          pSVar9 = CoreML::ShapeConstraint::channelRange(local_128);
          sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
          if (sVar10 == 4) {
            pSVar9 = CoreML::ShapeConstraint::channelRange(local_128);
            RVar12 = CoreML::ShapeRange::maximumValue(pSVar9);
            local_180._val = RVar12._val;
            local_180._isUnbound = RVar12._isUnbound;
            sVar10 = CoreML::RangeValue::value(&local_180);
            if (sVar10 == 4) {
              pSVar9 = CoreML::ShapeConstraint::heightRange(local_128);
              sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
              if (sVar10 == 1) {
                pSVar9 = CoreML::ShapeConstraint::heightRange(local_128);
                RVar12 = CoreML::ShapeRange::maximumValue(pSVar9);
                local_190._val = RVar12._val;
                local_190._isUnbound = RVar12._isUnbound;
                sVar10 = CoreML::RangeValue::value(&local_190);
                if (sVar10 == 1) {
                  pSVar9 = CoreML::ShapeConstraint::widthRange(local_128);
                  sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
                  if (sVar10 == 10) {
                    pSVar9 = CoreML::ShapeConstraint::widthRange(local_128);
                    RVar12 = CoreML::ShapeRange::maximumValue(pSVar9);
                    local_1a0._val = RVar12._val;
                    local_1a0._isUnbound = RVar12._isUnbound;
                    sVar10 = CoreML::RangeValue::value(&local_1a0);
                    if (sVar10 == 10) {
                      m1._oneof_case_[0] = 0;
                    }
                    else {
                      poVar11 = std::operator<<((ostream *)&std::cout,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                               );
                      poVar11 = std::operator<<(poVar11,":");
                      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x14d);
                      poVar11 = std::operator<<(poVar11,": error: ");
                      poVar11 = std::operator<<(poVar11,
                                                "inShape.widthRange().maximumValue().value() == 10")
                      ;
                      poVar11 = std::operator<<(poVar11," was false, expected true.");
                      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                      m1._oneof_case_[0] = 1;
                    }
                  }
                  else {
                    poVar11 = std::operator<<((ostream *)&std::cout,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             );
                    poVar11 = std::operator<<(poVar11,":");
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x14c);
                    poVar11 = std::operator<<(poVar11,": error: ");
                    poVar11 = std::operator<<(poVar11,"inShape.widthRange().minimumValue() == 10");
                    poVar11 = std::operator<<(poVar11," was false, expected true.");
                    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                    m1._oneof_case_[0] = 1;
                  }
                }
                else {
                  poVar11 = std::operator<<((ostream *)&std::cout,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                           );
                  poVar11 = std::operator<<(poVar11,":");
                  poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x14a);
                  poVar11 = std::operator<<(poVar11,": error: ");
                  poVar11 = std::operator<<(poVar11,
                                            "inShape.heightRange().maximumValue().value() == 1");
                  poVar11 = std::operator<<(poVar11," was false, expected true.");
                  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                  m1._oneof_case_[0] = 1;
                }
              }
              else {
                poVar11 = std::operator<<((ostream *)&std::cout,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                         );
                poVar11 = std::operator<<(poVar11,":");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x149);
                poVar11 = std::operator<<(poVar11,": error: ");
                poVar11 = std::operator<<(poVar11,"inShape.heightRange().minimumValue() == 1");
                poVar11 = std::operator<<(poVar11," was false, expected true.");
                std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                m1._oneof_case_[0] = 1;
              }
            }
            else {
              poVar11 = std::operator<<((ostream *)&std::cout,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                       );
              poVar11 = std::operator<<(poVar11,":");
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x147);
              poVar11 = std::operator<<(poVar11,": error: ");
              poVar11 = std::operator<<(poVar11,"inShape.channelRange().maximumValue().value() == 4"
                                       );
              poVar11 = std::operator<<(poVar11," was false, expected true.");
              std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
              m1._oneof_case_[0] = 1;
            }
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cout,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                     );
            poVar11 = std::operator<<(poVar11,":");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x146);
            poVar11 = std::operator<<(poVar11,": error: ");
            poVar11 = std::operator<<(poVar11,"inShape.channelRange().minimumValue() == 4");
            poVar11 = std::operator<<(poVar11," was false, expected true.");
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,":");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x144);
          poVar11 = std::operator<<(poVar11,": error: ");
          poVar11 = std::operator<<(poVar11,"inShape.batchRange().maximumValue().isUnbound()");
          poVar11 = std::operator<<(poVar11," was false, expected true.");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
      }
      else {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                 );
        poVar11 = std::operator<<(poVar11,":");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x143);
        poVar11 = std::operator<<(poVar11,": error: ");
        poVar11 = std::operator<<(poVar11,"inShape.batchRange().minimumValue() == 0");
        poVar11 = std::operator<<(poVar11," was false, expected true.");
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               );
      poVar11 = std::operator<<(poVar11,":");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x141);
      poVar11 = std::operator<<(poVar11,": error: ");
      poVar11 = std::operator<<(poVar11,"inShape.sequenceRange().maximumValue().isUnbound()");
      poVar11 = std::operator<<(poVar11," was false, expected true.");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x140);
    poVar11 = std::operator<<(poVar11,": error: ");
    poVar11 = std::operator<<(poVar11,"inShape.sequenceRange().minimumValue() == 0");
    poVar11 = std::operator<<(poVar11," was false, expected true.");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  local_150 = 1;
  CoreML::NeuralNetworkShaper::~NeuralNetworkShaper((NeuralNetworkShaper *)&inShape);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testUpwardPass() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(1);
    shape2->set_upperbound(1);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(1);
    shape3->set_upperbound(-1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("conv_out");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(1);
    convParams->add_kernelsize(10);
    convParams->mutable_valid();
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*10; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    Specification::NeuralNetworkLayer *ipLayer = nn->add_layers();
    ipLayer->add_input("conv_out");
    ipLayer->add_output("output");
    Specification::InnerProductLayerParams *ipParams = ipLayer->mutable_innerproduct();
    ipParams->set_inputchannels(5);
    ipParams->set_outputchannels(1);
    ipParams->set_hasbias(false);
    for (int i = 0; i < 5; i++) {
        ipParams->mutable_weights()->add_floatvalue(1.0);
    }

    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());

    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 1);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 1);

    ML_ASSERT(inShape.widthRange().minimumValue() == 10);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 10);
    
    return 0;
    
}